

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O3

void __thiscall
hta::detail::
make_exception<const_char_*,_std::filesystem::__cxx11::path,_const_char_*,_std::fpos<__mbstate_t>,_const_char_*,_std::fpos<__mbstate_t>_>
::operator()(make_exception<const_char_*,_std::filesystem::__cxx11::path,_const_char_*,_std::fpos<__mbstate_t>,_const_char_*,_std::fpos<__mbstate_t>_>
             *this,stringstream *msg,char *arg,path args,char *args_1,fpos<__mbstate_t> args_2,
            char *args_3,fpos<__mbstate_t> args_4)

{
  ostream *__os;
  fpos<__mbstate_t> args_2_00;
  size_t sVar1;
  make_exception<const_char_*,_std::fpos<__mbstate_t>,_const_char_*,_std::fpos<__mbstate_t>_>
  local_79;
  char *local_78;
  __mbstate_t local_70;
  size_type local_68;
  __mbstate_t _Stack_60;
  path local_58;
  
  local_70 = args_2._M_state;
  local_78 = (char *)args_2._M_off;
  __os = (ostream *)(msg + 0x10);
  if (arg == (char *)0x0) {
    std::ios::clear((int)__os + (int)*(undefined8 *)(*(long *)__os + -0x18));
  }
  else {
    sVar1 = strlen(arg);
    std::__ostream_insert<char,std::char_traits<char>>(__os,arg,sVar1);
  }
  Catch::clara::std::filesystem::__cxx11::path::path(&local_58,(path *)args_1);
  local_68 = args._M_pathname.field_2._M_allocated_capacity;
  _Stack_60.__count = args._M_pathname.field_2._8_4_;
  _Stack_60.__value = (anon_union_4_2_91654ee9_for___value)args._M_pathname.field_2._12_4_;
  std::filesystem::__cxx11::operator<<(__os,(path *)&local_58);
  args_2_00._M_state = _Stack_60;
  args_2_00._M_off = local_68;
  make_exception<const_char_*,_std::fpos<__mbstate_t>,_const_char_*,_std::fpos<__mbstate_t>_>::
  operator()(&local_79,msg,local_78,(fpos<__mbstate_t>)args._M_pathname._0_16_,(char *)local_70,
             args_2_00);
  Catch::clara::std::filesystem::__cxx11::path::~path(&local_58);
  return;
}

Assistant:

void operator()(std::stringstream& msg, Arg arg, Args... args)
        {
            msg << arg;
            make_exception<Args...>()(msg, args...);
        }